

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O0

void do_actual_learning_ldf<false>(cbify *data,multi_learner *base,multi_ex *ec_seq)

{
  long lVar1;
  value_type peVar2;
  int iVar3;
  score_iterator *pdf_first;
  vw_exception *pvVar4;
  reference ppeVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  string *pmessage;
  action_score *paVar9;
  undefined8 uVar10;
  size_type sVar11;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  long in_RDI;
  size_t i_1;
  label *lab;
  stringstream __msg_1;
  cb_class cl;
  stringstream __msg;
  uint32_t chosen_action;
  example *out_ec;
  example *ec;
  size_t i;
  vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  *cb_as;
  vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_> *cb_costs;
  vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
  *cs_costs;
  undefined4 in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbac;
  uint32_t uVar12;
  v_array<CB::cb_class> *in_stack_fffffffffffffbb0;
  action_scores *in_stack_fffffffffffffbb8;
  size_type sVar13;
  learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *in_stack_fffffffffffffbc0;
  string *in_stack_fffffffffffffbc8;
  vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  *in_stack_fffffffffffffbd0;
  int plineNumber;
  value_type in_stack_fffffffffffffbd8;
  vw_exception *this;
  cbify *data_00;
  size_type local_400;
  stringstream local_3c8 [16];
  ostream local_3b8;
  float local_23c;
  uint32_t local_238;
  float local_234;
  undefined1 local_229;
  stringstream local_1f8 [16];
  ostream local_1e8;
  uint local_4c;
  value_type local_48;
  value_type local_40;
  vw_exception *local_38;
  vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  *local_30;
  cbify *local_28;
  score_iterator *local_20;
  vector<example_*,_std::allocator<example_*>_> *local_18;
  long local_8;
  
  pdf_first = (score_iterator *)(in_RDI + 0x88);
  local_28 = (cbify *)(in_RDI + 0xa0);
  local_30 = (vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
              *)(in_RDI + 0xb8);
  local_20 = pdf_first;
  local_18 = in_RDX;
  local_8 = in_RDI;
  std::vector<example_*,_std::allocator<example_*>_>::size(in_RDX);
  std::vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>::
  resize((vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
          *)in_stack_fffffffffffffbd0,(size_type)in_stack_fffffffffffffbc8);
  data_00 = local_28;
  std::vector<example_*,_std::allocator<example_*>_>::size(local_18);
  std::vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>::resize
            ((vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_> *)
             in_stack_fffffffffffffbd0,(size_type)in_stack_fffffffffffffbc8);
  std::vector<example_*,_std::allocator<example_*>_>::size(local_18);
  std::
  vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  ::resize(in_stack_fffffffffffffbd0,(size_type)in_stack_fffffffffffffbc8);
  local_38 = (vw_exception *)0x0;
  while( true ) {
    this = local_38;
    pvVar4 = (vw_exception *)std::vector<example_*,_std::allocator<example_*>_>::size(local_18);
    if (pvVar4 <= this) break;
    ppeVar5 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                        (local_18,(size_type)local_38);
    in_stack_fffffffffffffbd8 = *ppeVar5;
    local_40 = in_stack_fffffffffffffbd8;
    pvVar6 = std::
             vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
             ::operator[]((vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
                           *)local_20,(size_type)local_38);
    pvVar6->_begin = (wclass *)(in_stack_fffffffffffffbd8->l).multi;
    pvVar6->_end = (in_stack_fffffffffffffbd8->l).cs.costs._end;
    pvVar6->end_array = (in_stack_fffffffffffffbd8->l).cs.costs.end_array;
    pvVar6->erase_count = (in_stack_fffffffffffffbd8->l).cs.costs.erase_count;
    std::vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>::operator[]
              ((vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_> *)local_28,
               (size_type)local_38);
    v_array<CB::cb_class>::clear(in_stack_fffffffffffffbb0);
    std::
    vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
    ::operator[](local_30,(size_type)local_38);
    v_array<ACTION_SCORE::action_score>::clear
              ((v_array<ACTION_SCORE::action_score> *)in_stack_fffffffffffffbb0);
    pvVar7 = std::vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>::operator[]
                       ((vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_> *)
                        local_28,(size_type)local_38);
    (local_40->l).multi = (label_t)pvVar7->_begin;
    (local_40->l).cs.costs._end = (wclass *)pvVar7->_end;
    (local_40->l).cs.costs.end_array = (wclass *)pvVar7->end_array;
    (local_40->l).cs.costs.erase_count = pvVar7->erase_count;
    pvVar8 = std::
             vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
             ::operator[](local_30,(size_type)local_38);
    (local_40->pred).scalars._begin = (float *)pvVar8->_begin;
    (local_40->pred).scalars._end = (float *)pvVar8->_end;
    (local_40->pred).scalars.end_array = (float *)pvVar8->end_array;
    (local_40->pred).scalars.erase_count = pvVar8->erase_count;
    local_38 = (vw_exception *)&local_38->field_0x1;
  }
  LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::predict
            (in_stack_fffffffffffffbc0,
             (vector<example_*,_std::allocator<example_*>_> *)in_stack_fffffffffffffbb8,
             (size_t)in_stack_fffffffffffffbb0);
  ppeVar5 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,0);
  local_48 = *ppeVar5;
  lVar1 = *(long *)(local_8 + 0x48);
  *(long *)(local_8 + 0x48) = lVar1 + 1;
  plineNumber = (int)((ulong)(*(long *)(local_8 + 0x20) + lVar1) >> 0x20);
  ACTION_SCORE::begin_scores(in_stack_fffffffffffffbb8);
  ACTION_SCORE::end_scores(in_stack_fffffffffffffbb8);
  iVar3 = exploration::sample_after_normalizing<ACTION_SCORE::score_iterator>
                    ((uint64_t)data_00,pdf_first,(score_iterator *)this,
                     (uint32_t *)in_stack_fffffffffffffbd8);
  if (iVar3 != 0) {
    std::__cxx11::stringstream::stringstream(local_1f8);
    std::operator<<(&local_1e8,"Failed to sample from pdf");
    local_229 = 1;
    pmessage = (string *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception(this,(char *)in_stack_fffffffffffffbd8,plineNumber,pmessage);
    local_229 = 0;
    __cxa_throw(pmessage,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  paVar9 = v_array<ACTION_SCORE::action_score>::operator[]
                     ((v_array<ACTION_SCORE::action_score> *)&(local_48->pred).scalars,
                      (ulong)local_4c);
  local_238 = paVar9->action + 1;
  paVar9 = v_array<ACTION_SCORE::action_score>::operator[]
                     ((v_array<ACTION_SCORE::action_score> *)&(local_48->pred).scalars,
                      (ulong)local_4c);
  local_234 = paVar9->score;
  if (local_238 == 0) {
    std::__cxx11::stringstream::stringstream(local_3c8);
    std::operator<<(&local_3b8,"No action with non-zero probability found!");
    uVar10 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (this,(char *)in_stack_fffffffffffffbd8,plineNumber,in_stack_fffffffffffffbc8);
    __cxa_throw(uVar10,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  local_23c = loss_csldf(data_00,(vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
                                  *)pdf_first,(uint32_t)((ulong)this >> 0x20));
  std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,(ulong)(local_238 - 1));
  v_array<CB::cb_class>::push_back
            (in_stack_fffffffffffffbb0,
             (cb_class *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::learn
            (in_stack_fffffffffffffbc0,
             (vector<example_*,_std::allocator<example_*>_> *)in_stack_fffffffffffffbb8,
             (size_t)in_stack_fffffffffffffbb0);
  local_400 = 0;
  while( true ) {
    sVar13 = local_400;
    sVar11 = std::vector<example_*,_std::allocator<example_*>_>::size(local_18);
    if (sVar11 <= sVar13) break;
    if (local_400 == local_238 - 1) {
      uVar12 = local_238;
      ppeVar5 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,local_400);
      ((*ppeVar5)->pred).multiclass = uVar12;
      pvVar6 = std::
               vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
               ::operator[]((vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
                             *)local_20,(ulong)(local_238 - 1));
      ppeVar5 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,local_400);
      peVar2 = *ppeVar5;
      (peVar2->l).multi = (label_t)pvVar6->_begin;
      (peVar2->l).cs.costs._end = pvVar6->_end;
      (peVar2->l).cs.costs.end_array = pvVar6->end_array;
      (peVar2->l).cs.costs.erase_count = pvVar6->erase_count;
    }
    else {
      ppeVar5 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,local_400);
      ((*ppeVar5)->pred).scalar = 0.0;
    }
    local_400 = local_400 + 1;
  }
  return;
}

Assistant:

void do_actual_learning_ldf(cbify& data, multi_learner& base, multi_ex& ec_seq)
{
  auto& cs_costs = data.cs_costs;
  auto& cb_costs = data.cb_costs;
  auto& cb_as = data.cb_as;

  // change label and pred data for cb
  cs_costs.resize(ec_seq.size());
  cb_costs.resize(ec_seq.size());
  cb_as.resize(ec_seq.size());
  for (size_t i = 0; i < ec_seq.size(); ++i)
  {
    auto& ec = *ec_seq[i];
    cs_costs[i] = ec.l.cs.costs;
    cb_costs[i].clear();
    cb_as[i].clear();
    ec.l.cb.costs = cb_costs[i];
    ec.pred.a_s = cb_as[i];
  }

  base.predict(ec_seq);

  auto& out_ec = *ec_seq[0];

  uint32_t chosen_action;
  if (sample_after_normalizing(data.app_seed + data.example_counter++, begin_scores(out_ec.pred.a_s), end_scores(out_ec.pred.a_s), chosen_action))
    THROW("Failed to sample from pdf");

  CB::cb_class cl;
  cl.action = out_ec.pred.a_s[chosen_action].action + 1;
  cl.probability = out_ec.pred.a_s[chosen_action].score;

  if(!cl.action)
    THROW("No action with non-zero probability found!");

  cl.cost = loss_csldf(data, cs_costs, cl.action);

  // add cb label to chosen action
  auto& lab = ec_seq[cl.action - 1]->l.cb;
  lab.costs.push_back(cl);

  base.learn(ec_seq);

  // set cs prediction and reset cs costs
  for (size_t i = 0; i < ec_seq.size(); ++i)
  {
    if (i == cl.action - 1)
    {
      ec_seq[i]->pred.multiclass = cl.action;
      ec_seq[i]->l.cs.costs = cs_costs[cl.action - 1]; // only need this cost for eval
    }
    else
      ec_seq[i]->pred.multiclass = 0;
  }
}